

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_3cd9::test_iterator_create_last(void **param_1)

{
  roaring64_iterator_t *prVar1;
  roaring64_iterator_t *it_00;
  roaring64_iterator_t *it_01;
  roaring64_iterator_t *it_3;
  roaring64_iterator_t *it_2;
  roaring64_iterator_t *it_1;
  roaring64_iterator_t *it;
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *in_stack_00000050;
  int in_stack_ffffffffffffffcc;
  roaring64_bitmap_t *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  roaring64_bitmap_t *in_stack_ffffffffffffffe0;
  
  roaring64_bitmap_create();
  prVar1 = roaring64_iterator_create_last(in_stack_ffffffffffffffd0);
  roaring64_iterator_has_value(prVar1);
  _assert_true((unsigned_long)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
               (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  roaring64_iterator_free((roaring64_iterator_t *)0x107d17);
  roaring64_bitmap_add(in_stack_ffffffffffffffe0,(uint64_t)in_stack_ffffffffffffffd8);
  prVar1 = roaring64_iterator_create_last(in_stack_ffffffffffffffd0);
  roaring64_iterator_has_value(prVar1);
  _assert_true((unsigned_long)prVar1,in_stack_ffffffffffffffd8,(char *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  roaring64_iterator_value(prVar1);
  _assert_int_equal((unsigned_long)prVar1,(unsigned_long)in_stack_ffffffffffffffd8,
                    (char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  roaring64_iterator_free((roaring64_iterator_t *)0x107d89);
  roaring64_bitmap_add((roaring64_bitmap_t *)prVar1,(uint64_t)in_stack_ffffffffffffffd8);
  it_00 = roaring64_iterator_create_last(in_stack_ffffffffffffffd0);
  roaring64_iterator_has_value(it_00);
  _assert_true((unsigned_long)prVar1,(char *)it_00,(char *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffcc);
  roaring64_iterator_value(it_00);
  _assert_int_equal((unsigned_long)prVar1,(unsigned_long)it_00,(char *)in_stack_ffffffffffffffd0,
                    in_stack_ffffffffffffffcc);
  roaring64_iterator_free((roaring64_iterator_t *)0x107e07);
  roaring64_bitmap_remove((roaring64_bitmap_t *)prVar1,(uint64_t)it_00);
  it_01 = roaring64_iterator_create_last(in_stack_ffffffffffffffd0);
  roaring64_iterator_has_value(it_01);
  _assert_true((unsigned_long)prVar1,(char *)it_00,(char *)it_01,in_stack_ffffffffffffffcc);
  roaring64_iterator_value(it_01);
  _assert_int_equal((unsigned_long)prVar1,(unsigned_long)it_00,(char *)it_01,
                    in_stack_ffffffffffffffcc);
  roaring64_iterator_free((roaring64_iterator_t *)0x107e7f);
  roaring64_bitmap_free(in_stack_00000050);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_create_last) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_false(roaring64_iterator_has_value(it));
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_add(r, 0);
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_true(roaring64_iterator_has_value(it));
        assert_int_equal(roaring64_iterator_value(it), 0);
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_add(r, (1ULL << 40) + 1234);
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_true(roaring64_iterator_has_value(it));
        assert_int_equal(roaring64_iterator_value(it), ((1ULL << 40) + 1234));
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_remove(r, 0);
    {
        roaring64_iterator_t* it = roaring64_iterator_create_last(r);
        assert_true(roaring64_iterator_has_value(it));
        assert_int_equal(roaring64_iterator_value(it), ((1ULL << 40) + 1234));
        roaring64_iterator_free(it);
    }
    roaring64_bitmap_free(r);
}